

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagObjectModel.cpp
# Opt level: O2

Var __thiscall
Js::LocalObjectAddressForRegSlot::GetValue(LocalObjectAddressForRegSlot *this,BOOL fUpdated)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  undefined4 *puVar4;
  undefined4 extraout_var;
  DiagStackFrame *pDVar5;
  
  if (fUpdated != 0) {
    iVar3 = (*(this->super_IDiagObjectAddress)._vptr_IDiagObjectAddress[3])(this);
    if (iVar3 == 0) {
      pDVar5 = this->pFrame;
      if (pDVar5 != (DiagStackFrame *)0x0) {
LAB_007ea16d:
        iVar3 = (*pDVar5->_vptr_DiagStackFrame[5])(pDVar5,(ulong)this->regSlot,0);
        return (Var)CONCAT44(extraout_var,iVar3);
      }
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                                  ,0x6ab,"(pFrame)","pFrame");
      if (bVar2) {
        *puVar4 = 0;
        pDVar5 = this->pFrame;
        goto LAB_007ea16d;
      }
      goto LAB_007ea17f;
    }
  }
  iVar3 = (*(this->super_IDiagObjectAddress)._vptr_IDiagObjectAddress[3])(this);
  if (iVar3 != 0) {
    bVar2 = VarIs<Js::JavascriptString>(this->value);
    if (!bVar2) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                                  ,0x6a4,"(VarIs<JavascriptString>(value))",
                                  "VarIs<JavascriptString>(value)");
      if (!bVar2) {
LAB_007ea17f:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar4 = 0;
    }
  }
  return this->value;
}

Assistant:

Var LocalObjectAddressForRegSlot::GetValue(BOOL fUpdated)
    {
        if (!fUpdated || IsInDeadZone())
        {
#if DBG
            if (IsInDeadZone())
            {
                // If we're in a dead zone, the value will be the
                // [Uninitialized block variable] string.
                Assert(VarIs<JavascriptString>(value));
            }
#endif // DBG

            return value;
        }

        Assert(pFrame);
        return pFrame->GetRegValue(regSlot);
    }